

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

int error(char *cp)

{
  int iVar1;
  LispPTR LVar2;
  FILE *pFVar3;
  int c;
  int stat;
  char *ptr;
  char *cp_local;
  
  iVar1 = device_before_raid();
  if (iVar1 < 0) {
    fprintf(_stderr,"Can\'t Enter URAID.\n");
    exit(-1);
  }
  URaid_errmess = cp;
  fprintf(_stderr,"\n*Error* %s\n",cp);
  fflush(_stdin);
  fprintf(_stderr,"Enter the URaid\n");
  print(Uraid_mess);
  putchar(10);
  fflush(_stdout);
  fflush(_stderr);
  URaid_currentFX = 0x7d1;
  memset(URaid_FXarray,0,8000);
  iVar1 = fileno(_stdin);
  iVar1 = fcntl(iVar1,3,0);
  if (((iVar1 != 0) && (iVar1 != 2)) &&
     (pFVar3 = freopen("/dev/tty","r",_stdin), pFVar3 == (FILE *)0x0)) {
    perror("Reopen of stdin failed.");
    exit(0);
  }
  while( true ) {
    do {
      do {
        iVar1 = _setjmp((__jmp_buf_tag *)BT_jumpbuf);
      } while (iVar1 == 1);
      iVar1 = _setjmp((__jmp_buf_tag *)SD_jumpbuf);
    } while (iVar1 == 1);
    while( true ) {
      uraid_commclear();
      BT_temp = 0;
      printf("\n< ");
      _c = URaid_inputstring;
      while( true ) {
        iVar1 = getchar();
        *_c = (char)iVar1;
        if ((char)iVar1 == '\n') break;
        _c = _c + 1;
      }
      URaid_argnum = __isoc99_sscanf(URaid_inputstring,"%1s%s%s",URaid_comm,URaid_arg1,URaid_arg2);
      LVar2 = uraid_commands();
      if (LVar2 == 0) break;
      fflush(_stdout);
      fflush(_stderr);
    }
    iVar1 = device_after_raid();
    if (-1 < iVar1) break;
    printf("Can\'t return to Lisp. Return to UNIX?");
    iVar1 = getchar();
    if ((iVar1 == 0x59) || (iVar1 == 0x79)) {
      exit(-1);
    }
    fflush(_stdin);
  }
  return 0;
}

Assistant:

int error(const char *cp) {
  char *ptr;
  if (device_before_raid() < 0) {
    (void)fprintf(stderr, "Can't Enter URAID.\n");
    exit(-1);
  }
  /* comm read */
  URaid_errmess = cp;
  (void)fprintf(stderr, "\n*Error* %s\n", cp);
  fflush(stdin);
  (void)fprintf(stderr, "Enter the URaid\n");
  print(Uraid_mess);
  putchar('\n');
  /* XXX: make sure output is flushed so we can see where we are */
  fflush(stdout); fflush(stderr);
  URaid_currentFX = URMAXFXNUM + 1;
  memset(URaid_FXarray, 0, URMAXFXNUM * 4);
#ifndef DOS
  {
    int stat = fcntl(fileno(stdin), F_GETFL, 0);
    if (stat != O_RDONLY && stat != O_RDWR)
      if (freopen("/dev/tty", "r", stdin) == NULL) {
        perror("Reopen of stdin failed.");
        exit(0);
      }
  }
#endif /* DOS */
uraidloop:
  if (setjmp(BT_jumpbuf) == 1) goto uraidloop;
  if (setjmp(SD_jumpbuf) == 1) goto uraidloop;
  for (;;) { /* URAID LOOP */

    uraid_commclear();
    BT_temp = 0; /* So we get the "more" option on screen-full */
    printf("\n< ");
    for (ptr = URaid_inputstring; (*ptr = getchar()) != '\n'; ptr++) {}
    URaid_argnum = sscanf(URaid_inputstring, "%1s%s%s", URaid_comm, URaid_arg1, URaid_arg2);

    if (uraid_commands() == NIL) break;
    /* XXX: make sure output is flushed so we can see where we are */
    fflush(stdout); fflush(stderr);
  } /* for end */

  /**TopOfStack = NIL;if error is called from subr TOS will be set NIL**/
  if (device_after_raid() < 0) {
    printf("Can't return to Lisp. Return to UNIX?");
    {
      int c;
      c = getchar();
      if ((c == 'Y') || (c == 'y')) exit(-1);
    }
    fflush(stdin);
    goto uraidloop;
  }
  return (0);
}